

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_DCtx_loadDictionary_advanced
                 (ZSTD_DCtx *dctx,void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
                 ZSTD_dictContentType_e dictContentType)

{
  ZSTD_DDict *pZVar1;
  
  if (dctx->streamStage != zdss_init) {
    return 0xffffffffffffffc4;
  }
  ZSTD_freeDDict(dctx->ddictLocal);
  if (dictSize < 8 || dict == (void *)0x0) {
    dctx->ddictLocal = (ZSTD_DDict *)0x0;
  }
  else {
    pZVar1 = ZSTD_createDDict_advanced(dict,dictSize,dictLoadMethod,dictContentType,dctx->customMem)
    ;
    dctx->ddictLocal = pZVar1;
    if (pZVar1 == (ZSTD_DDict *)0x0) {
      return 0xffffffffffffffc0;
    }
  }
  dctx->ddict = dctx->ddictLocal;
  return 0;
}

Assistant:

size_t ZSTD_DCtx_loadDictionary_advanced(ZSTD_DCtx* dctx,
                                   const void* dict, size_t dictSize,
                                         ZSTD_dictLoadMethod_e dictLoadMethod,
                                         ZSTD_dictContentType_e dictContentType)
{
    if (dctx->streamStage != zdss_init) return ERROR(stage_wrong);
    ZSTD_freeDDict(dctx->ddictLocal);
    if (dict && dictSize >= 8) {
        dctx->ddictLocal = ZSTD_createDDict_advanced(dict, dictSize, dictLoadMethod, dictContentType, dctx->customMem);
        if (dctx->ddictLocal == NULL) return ERROR(memory_allocation);
    } else {
        dctx->ddictLocal = NULL;
    }
    dctx->ddict = dctx->ddictLocal;
    return 0;
}